

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlencode.c
# Opt level: O0

STRING_HANDLE URL_EncodeString(char *textEncode)

{
  undefined8 local_18;
  STRING_HANDLE result;
  char *textEncode_local;
  
  if (textEncode == (char *)0x0) {
    local_18 = (STRING_HANDLE)0x0;
  }
  else {
    local_18 = encode_url_data(textEncode);
  }
  return local_18;
}

Assistant:

STRING_HANDLE URL_EncodeString(const char* textEncode)
{
    STRING_HANDLE result;
    if (textEncode == NULL)
    {
        result = NULL;
    }
    else
    {
        result = encode_url_data(textEncode);
    }
    return result;
}